

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8l_dec.c
# Opt level: O0

int DecodeAlphaData(VP8LDecoder *dec,uint8_t *data,int width,int height,int last_row)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  HTreeGroup *table;
  HTreeGroup *dec_00;
  int in_ECX;
  int in_EDX;
  VP8StatusCode error;
  long in_RSI;
  VP8LDecoder *in_RDI;
  int in_R8D;
  int dist_symbol;
  int length;
  int length_sym;
  int dist;
  int dist_code;
  int code;
  HTreeGroup *htree_group;
  int mask;
  int len_code_limit;
  int last;
  int end;
  int pos;
  VP8LMetadata *hdr;
  VP8LBitReader *br;
  int col;
  int row;
  int ok;
  int in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  VP8LMetadata *in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff78;
  uint in_stack_ffffffffffffff7c;
  int in_stack_ffffffffffffff9c;
  int local_44;
  uint local_30;
  int local_2c;
  int local_28;
  int local_4;
  
  local_28 = 1;
  local_2c = in_RDI->last_pixel_ / in_EDX;
  local_30 = in_RDI->last_pixel_ % in_EDX;
  local_44 = in_RDI->last_pixel_;
  iVar3 = in_EDX * in_R8D;
  uVar1 = (in_RDI->hdr_).huffman_mask_;
  if (local_44 < iVar3) {
    table = GetHtreeGroupForPos(in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,
                                in_stack_ffffffffffffff68);
    dec_00 = table;
  }
  else {
    table = (HTreeGroup *)0x0;
    dec_00 = table;
  }
  do {
    uVar2 = in_stack_ffffffffffffff7c & 0xffffff;
    if ((in_RDI->br_).eos_ == 0) {
      uVar2 = CONCAT13(local_44 < iVar3,(int3)in_stack_ffffffffffffff7c);
    }
    in_stack_ffffffffffffff7c = uVar2;
    if ((char)(in_stack_ffffffffffffff7c >> 0x18) == '\0') {
      ExtractPalettedAlphaRows((VP8LDecoder *)dec_00,in_stack_ffffffffffffff9c);
      goto LAB_00114685;
    }
    if ((local_30 & uVar1) == 0) {
      dec_00 = GetHtreeGroupForPos(in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,
                                   in_stack_ffffffffffffff68);
    }
    VP8LFillBitWindow((VP8LBitReader *)0x11443f);
    in_stack_ffffffffffffff9c =
         ReadSymbol((HuffmanCode *)table,
                    (VP8LBitReader *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    if (in_stack_ffffffffffffff9c < 0x100) {
      *(char *)(in_RSI + local_44) = (char)in_stack_ffffffffffffff9c;
      local_44 = local_44 + 1;
      local_30 = local_30 + 1;
      if (in_EDX <= (int)local_30) {
        local_30 = 0;
        local_2c = local_2c + 1;
        if ((local_2c <= in_R8D) && (local_2c % 0x10 == 0)) {
          ExtractPalettedAlphaRows((VP8LDecoder *)dec_00,in_stack_ffffffffffffff9c);
        }
      }
    }
    else {
      if (0x117 < in_stack_ffffffffffffff9c) {
        local_28 = 0;
        goto LAB_00114685;
      }
      iVar5 = GetCopyLength((int)((ulong)in_stack_ffffffffffffff70 >> 0x20),
                            (VP8LBitReader *)
                            CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
      ReadSymbol((HuffmanCode *)table,
                 (VP8LBitReader *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
      VP8LFillBitWindow((VP8LBitReader *)0x114529);
      iVar4 = GetCopyDistance((int)table,
                              (VP8LBitReader *)
                              CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
      iVar4 = PlaneCodeToDistance(in_EDX,iVar4);
      if ((local_44 < iVar4) || (in_EDX * in_ECX - local_44 < iVar5)) {
        local_28 = 0;
LAB_00114685:
        iVar3 = VP8LIsEndOfStream(&in_RDI->br_);
        (in_RDI->br_).eos_ = iVar3;
        if ((local_28 == 0) || (((in_RDI->br_).eos_ != 0 && (local_44 < in_EDX * in_ECX)))) {
          error = VP8_STATUS_BITSTREAM_ERROR;
          if ((in_RDI->br_).eos_ != 0) {
            error = VP8_STATUS_SUSPENDED;
          }
          local_4 = VP8LSetError(in_RDI,error);
        }
        else {
          in_RDI->last_pixel_ = local_44;
          local_4 = local_28;
        }
        return local_4;
      }
      CopyBlock8b((uint8_t *)table,in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78);
      local_44 = iVar5 + local_44;
      local_30 = iVar5 + local_30;
      while (in_EDX <= (int)local_30) {
        local_30 = local_30 - in_EDX;
        local_2c = local_2c + 1;
        if ((local_2c <= in_R8D) && (local_2c % 0x10 == 0)) {
          ExtractPalettedAlphaRows((VP8LDecoder *)dec_00,in_stack_ffffffffffffff9c);
        }
      }
      if ((local_44 < iVar3) && ((local_30 & uVar1) != 0)) {
        dec_00 = GetHtreeGroupForPos(in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,
                                     in_stack_ffffffffffffff68);
      }
    }
    iVar5 = VP8LIsEndOfStream(&in_RDI->br_);
    (in_RDI->br_).eos_ = iVar5;
  } while( true );
}

Assistant:

static int DecodeAlphaData(VP8LDecoder* const dec, uint8_t* const data,
                           int width, int height, int last_row) {
  int ok = 1;
  int row = dec->last_pixel_ / width;
  int col = dec->last_pixel_ % width;
  VP8LBitReader* const br = &dec->br_;
  VP8LMetadata* const hdr = &dec->hdr_;
  int pos = dec->last_pixel_;         // current position
  const int end = width * height;     // End of data
  const int last = width * last_row;  // Last pixel to decode
  const int len_code_limit = NUM_LITERAL_CODES + NUM_LENGTH_CODES;
  const int mask = hdr->huffman_mask_;
  const HTreeGroup* htree_group =
      (pos < last) ? GetHtreeGroupForPos(hdr, col, row) : NULL;
  assert(pos <= end);
  assert(last_row <= height);
  assert(Is8bOptimizable(hdr));

  while (!br->eos_ && pos < last) {
    int code;
    // Only update when changing tile.
    if ((col & mask) == 0) {
      htree_group = GetHtreeGroupForPos(hdr, col, row);
    }
    assert(htree_group != NULL);
    VP8LFillBitWindow(br);
    code = ReadSymbol(htree_group->htrees[GREEN], br);
    if (code < NUM_LITERAL_CODES) {  // Literal
      data[pos] = code;
      ++pos;
      ++col;
      if (col >= width) {
        col = 0;
        ++row;
        if (row <= last_row && (row % NUM_ARGB_CACHE_ROWS == 0)) {
          ExtractPalettedAlphaRows(dec, row);
        }
      }
    } else if (code < len_code_limit) {  // Backward reference
      int dist_code, dist;
      const int length_sym = code - NUM_LITERAL_CODES;
      const int length = GetCopyLength(length_sym, br);
      const int dist_symbol = ReadSymbol(htree_group->htrees[DIST], br);
      VP8LFillBitWindow(br);
      dist_code = GetCopyDistance(dist_symbol, br);
      dist = PlaneCodeToDistance(width, dist_code);
      if (pos >= dist && end - pos >= length) {
        CopyBlock8b(data + pos, dist, length);
      } else {
        ok = 0;
        goto End;
      }
      pos += length;
      col += length;
      while (col >= width) {
        col -= width;
        ++row;
        if (row <= last_row && (row % NUM_ARGB_CACHE_ROWS == 0)) {
          ExtractPalettedAlphaRows(dec, row);
        }
      }
      if (pos < last && (col & mask)) {
        htree_group = GetHtreeGroupForPos(hdr, col, row);
      }
    } else {  // Not reached
      ok = 0;
      goto End;
    }
    br->eos_ = VP8LIsEndOfStream(br);
  }
  // Process the remaining rows corresponding to last row-block.
  ExtractPalettedAlphaRows(dec, row > last_row ? last_row : row);

 End:
  br->eos_ = VP8LIsEndOfStream(br);
  if (!ok || (br->eos_ && pos < end)) {
    return VP8LSetError(
        dec, br->eos_ ? VP8_STATUS_SUSPENDED : VP8_STATUS_BITSTREAM_ERROR);
  }
  dec->last_pixel_ = pos;
  return ok;
}